

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QWidget * __thiscall QWidget::focusProxy(QWidget *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (((lVar1 != 0) && (*(long *)(lVar1 + 0x30) != 0)) &&
     (*(int *)(*(long *)(lVar1 + 0x30) + 4) != 0)) {
    return *(QWidget **)(lVar1 + 0x38);
  }
  return (QWidget *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }